

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O3

void ** __thiscall QThreadStorageData::get(QThreadStorageData *this)

{
  QThreadData *pQVar1;
  pointer ppvVar2;
  long lVar3;
  
  pQVar1 = QThreadData::currentThreadData();
  if ((pQVar1 == (QThreadData *)0x0) &&
     (pQVar1 = QThreadData::createCurrentThreadData(), pQVar1 == (QThreadData *)0x0)) {
    get();
    return (void **)0x0;
  }
  lVar3 = (long)this->id;
  if ((pQVar1->tls).d.size <= lVar3) {
    QList<void_*>::resize(&pQVar1->tls,(long)(this->id + 1));
    lVar3 = (long)this->id;
  }
  ppvVar2 = QList<void_*>::data(&pQVar1->tls);
  ppvVar2 = ppvVar2 + lVar3;
  if (*ppvVar2 == (void *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  return ppvVar2;
}

Assistant:

void **QThreadStorageData::get() const
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::get: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);
    void **v = &tls[id];

    DEBUG_MSG("QThreadStorageData: Returning storage %d, data %p, for thread %p",
          id,
          *v,
          data->thread.loadRelaxed());

    return *v ? v : nullptr;
}